

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall TPZVec<TPZCompMesh_*>::ReallocForNuma(TPZVec<TPZCompMesh_*> *this)

{
  ulong uVar1;
  TPZCompMesh **__src;
  TPZCompMesh **__dest;
  
  uVar1 = this->fNElements;
  if ((uVar1 != 0) && (__src = this->fStore, __src != (TPZCompMesh **)0x0)) {
    __dest = (TPZCompMesh **)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 << 3);
    memcpy(__dest,__src,uVar1 << 3);
    operator_delete__(__src);
    this->fStore = __dest;
  }
  return;
}

Assistant:

void ReallocForNuma() {
        if (fNElements == 0 || fStore == NULL)
            return;
        T* newStore = new T[fNElements];
        memcpy((void*)newStore,(void*)fStore,fNElements*sizeof(T));
        delete [] fStore;
        fStore = newStore;
	}